

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase83::run(TestCase83 *this)

{
  _func_int **pp_Var1;
  Reader reader;
  bool bVar2;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  int in_R8D;
  ArrayPtr<const_char> AVar3;
  undefined8 in_stack_fffffffffffffd08;
  int local_2b8;
  bool local_2b1;
  undefined1 auStack_2b0 [7];
  bool _kj_shouldLog_2;
  size_t local_2a8;
  bool local_299;
  undefined1 auStack_298 [7];
  bool _kj_shouldLog_1;
  size_t local_290;
  undefined1 local_288 [8];
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response1;
  undefined1 auStack_218 [8];
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  undefined1 local_1d0 [7];
  bool _kj_shouldLog;
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> promise2;
  undefined1 local_180 [8];
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  request2;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> promise1;
  undefined1 local_f8 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request1;
  Client client;
  Client client2;
  undefined1 local_80 [8];
  Client client1;
  int callCount;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase83 *this_local;
  
  kj::EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  kj::WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  client1._16_4_ = 0;
  kj::heap<capnp::_::TestExtendsImpl,int&>((kj *)&client2.field_0x10,(int *)&client1.field_0x10);
  capnproto_test::capnp::test::TestExtends::Client::Client<capnp::_::TestExtendsImpl,void>
            ((Client *)local_80,(Own<capnp::_::TestExtendsImpl> *)&client2.field_0x10);
  kj::Own<capnp::_::TestExtendsImpl>::~Own((Own<capnp::_::TestExtendsImpl> *)&client2.field_0x10);
  capnproto_test::capnp::test::TestInterface::Client::Client
            ((Client *)&client.field_0x10,(Client *)(local_80 + *(long *)((long)local_80 + -0x20)));
  Capability::Client::castAs<capnproto_test::capnp::test::TestExtends>
            ((Client *)&request1.hook.ptr,
             (Client *)(&client.field_0x10 + *(long *)(client._16_8_ + -0x18)));
  pp_Var1 = request1.hook.ptr[-4]._vptr_RequestHook;
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&promise1.super_Pipeline._typeless.ops.disposer,
             (void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_f8,(Client *)((long)&request1.hook.ptr + (long)pp_Var1),
             (Maybe<capnp::MessageSize> *)&promise1.super_Pipeline._typeless.ops.disposer);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&promise1.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_f8,0x141);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&request2.hook.ptr,(int)local_f8,__buf,in_RCX,in_R8D);
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&promise2.super_Pipeline._typeless.ops.disposer,
             (void *)0x0);
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            ((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)local_180,(Client *)&request1.hook.ptr,
             (Maybe<capnp::MessageSize> *)&promise2.super_Pipeline._typeless.ops.disposer);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&promise2.super_Pipeline._typeless.ops.disposer);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
          *)local_1d0,(int)local_180,__buf_00,in_RCX,in_R8D);
  if (client1._16_4_ != 0) {
    response2.hook.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)response2.hook.ptr._7_1_ != false) {
      response2.hook.ptr._0_4_ = 0;
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,99,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
                 (char (*) [36])"failed: expected (0) == (callCount)",(int *)&response2.hook.ptr,
                 (int *)&client1.field_0x10);
      response2.hook.ptr._7_1_ = false;
    }
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)auStack_218,
             local_1d0);
  response1.hook.ptr = (ResponseHook *)auStack_218;
  reader._reader.capTable = response2.super_Reader._reader.capTable;
  reader._reader.segment = response2.super_Reader._reader.segment;
  reader._reader.data = response2.super_Reader._reader.data;
  reader._reader.pointers = response2.super_Reader._reader.pointers;
  reader._reader.dataSize = response2.super_Reader._reader.dataSize;
  reader._reader.pointerCount = response2.super_Reader._reader.pointerCount;
  reader._reader._38_2_ = response2.super_Reader._reader._38_2_;
  reader._reader._40_8_ = in_stack_fffffffffffffd08;
  checkTestMessage(reader);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             local_288,&request2.hook.ptr);
  _auStack_298 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                           ((Reader *)local_288);
  bVar2 = kj::operator==("bar",(StringPtr *)auStack_298);
  if (!bVar2) {
    local_299 = kj::_::Debug::shouldLog(ERROR);
    while (local_299 != false) {
      AVar3 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                        ((Reader *)local_288);
      _auStack_2b0 = AVar3;
      kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x6b,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (response1.getX())\", \"bar\", response1.getX()"
                 ,(char (*) [47])"failed: expected (\"bar\") == (response1.getX())",
                 (char (*) [4])0xa54964,(Reader *)auStack_2b0);
      local_299 = false;
    }
  }
  if (client1._16_4_ != 2) {
    local_2b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2b1 != false) {
      local_2b8 = 2;
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x6d,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
                 (char (*) [36])"failed: expected (2) == (callCount)",&local_2b8,
                 (int *)&client1.field_0x10);
      local_2b1 = false;
    }
  }
  Response<capnproto_test::capnp::test::TestInterface::FooResults>::~Response
            ((Response<capnproto_test::capnp::test::TestInterface::FooResults> *)local_288);
  Response<capnproto_test::capnp::test::TestAllTypes>::~Response
            ((Response<capnproto_test::capnp::test::TestAllTypes> *)auStack_218);
  RemotePromise<capnproto_test::capnp::test::TestAllTypes>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestAllTypes> *)local_1d0);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::~Request((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)local_180);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)
             &request2.hook.ptr);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_f8);
  capnproto_test::capnp::test::TestExtends::Client::~Client((Client *)&request1.hook.ptr);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)&client.field_0x10);
  capnproto_test::capnp::test::TestExtends::Client::~Client((Client *)local_80);
  kj::WaitScope::~WaitScope((WaitScope *)local_58);
  kj::EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Capability, Inheritance) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  test::TestExtends::Client client1(kj::heap<TestExtendsImpl>(callCount));
  test::TestInterface::Client client2 = client1;
  auto client = client2.castAs<test::TestExtends>();

  auto request1 = client.fooRequest();
  request1.setI(321);
  auto promise1 = request1.send();

  auto request2 = client.graultRequest();
  auto promise2 = request2.send();

  EXPECT_EQ(0, callCount);

  auto response2 = promise2.wait(waitScope);

  checkTestMessage(response2);

  auto response1 = promise1.wait(waitScope);

  EXPECT_EQ("bar", response1.getX());

  EXPECT_EQ(2, callCount);
}